

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd.cpp
# Opt level: O1

void __thiscall NshCmdInit_Success_Test::TestBody(NshCmdInit_Success_Test *this)

{
  undefined1 auVar1 [8];
  void *pvVar2;
  void *__dest;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar3;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  nsh_status_t status;
  nsh_cmd_t cmd;
  AssertHelper local_a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  pointer local_78;
  void *local_68;
  void *local_60;
  long local_58;
  nsh_status_t local_4c;
  nsh_cmd_t local_48;
  
  local_4c = nsh_cmd_init(&local_48,"test",cmd_test_handler);
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_98._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            ((internal *)local_88,"status","NSH_STATUS_OK",&local_4c,(nsh_status *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
LAB_00111ac8:
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  else {
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    std::vector<char,std::allocator<char>>::vector<char_const*,void>
              ((vector<char,std::allocator<char>> *)&local_68,"test",
               "28NshCmdInitEmpty_Success_Test",(allocator_type *)&local_a0);
    uVar4 = (long)local_60 - (long)local_68;
    if (uVar4 == 0) {
      __dest = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = operator_new(uVar4);
    }
    pvVar2 = local_68;
    __n = (long)local_60 - (long)local_68;
    if (__n != 0) {
      memmove(__dest,local_68,__n);
    }
    local_88 = (undefined1  [8])0x0;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_78 = (pointer)0x0;
    std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
              ((_Vector_base<char,_std::allocator<char>_> *)local_88,__n);
    auVar1 = local_88;
    if (local_60 != pvVar2) {
      memmove((void *)local_88,__dest,__n);
    }
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)auVar1 + __n);
    if (__dest != (void *)0x0) {
      operator_delete(__dest,uVar4);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<char>>::operator()
              (&local_98,local_88,(char (*) [16])"cmd.name");
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88,(long)local_78 - (long)local_88);
    }
    if (local_68 != (void *)0x0) {
      operator_delete(local_68,local_58 - (long)local_68);
    }
    if ((char)local_98._M_head_impl == '\0') {
      testing::Message::Message((Message *)local_88);
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                 ,0x1e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_88 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_88 + 8))();
      }
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_90;
      goto LAB_00111b4d;
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_98._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)cmd_test_handler
    ;
    testing::internal::
    CmpHelperEQ<nsh_status(*)(unsigned_int,char**),nsh_status(*)(unsigned_int,char**)>
              ((internal *)local_88,"cmd.handler","&cmd_test_handler",
               (_func_nsh_status_uint_char_ptr_ptr **)&local_48,
               (_func_nsh_status_uint_char_ptr_ptr **)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                 ,0x1f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      goto LAB_00111ac8;
    }
  }
  if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pbStack_80;
  local_90 = pbStack_80;
LAB_00111b4d:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_90);
  return;
}

Assistant:

TEST(NshCmdInit, Success)
{
    nsh_cmd_t cmd;
    auto status = nsh_cmd_init(&cmd, cmd_test_name, &cmd_test_handler);

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_THAT(cmd.name, ElementsAreArray(cmd_test_name));
    ASSERT_EQ(cmd.handler, &cmd_test_handler);
}